

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_lazy_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  uint8_t type;
  _Bool _Var1;
  uint uVar2;
  container_t *pcVar3;
  ushort *puVar4;
  roaring_bitmap_t *prVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint16_t key_00;
  roaring_array_t *ra;
  roaring_array_t *prVar12;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_5f;
  uint8_t local_5e;
  uint8_t local_5d;
  uint local_5c;
  roaring_array_t *local_58;
  roaring_array_t *local_50;
  ulong local_48;
  container_t *local_40;
  ulong local_38;
  
  local_5d = '\0';
  uVar7 = (x1->high_low_container).size;
  prVar5 = x2;
  if (uVar7 != 0) {
    uVar9 = (x2->high_low_container).size;
    local_48 = (ulong)uVar9;
    prVar5 = x1;
    if (uVar9 != 0) {
      local_50 = &roaring_bitmap_create_with_capacity(uVar9 + uVar7)->high_low_container;
      bVar8 = 1;
      if (((x1->high_low_container).flags & 1) == 0) {
        bVar8 = (x2->high_low_container).flags & 1;
      }
      local_50->flags = local_50->flags & 0xfe | bVar8;
      key_00 = *(x1->high_low_container).keys;
      puVar4 = (x2->high_low_container).keys;
      local_5c = 0;
      uVar11 = 0;
      local_58 = &x2->high_low_container;
      local_38 = (ulong)uVar7;
      while( true ) {
        key = *puVar4;
        uVar11 = (ulong)(int)uVar11;
        while( true ) {
          prVar12 = local_58;
          uVar9 = local_5c;
          iVar10 = (int)uVar11;
          if (key_00 == key) break;
          if (key <= key_00) {
            local_5f = local_58->typecodes[(ushort)local_5c];
            pcVar3 = get_copy_of_container
                               (local_58->containers[(ushort)local_5c],&local_5f,
                                (_Bool)(local_58->flags & 1));
            if ((prVar12->flags & 1) != 0) {
              prVar12->containers[(int)local_5c] = pcVar3;
              prVar12->typecodes[(int)local_5c] = local_5f;
            }
            ra_append(local_50,key,pcVar3,local_5f);
            uVar6 = local_5c + 1;
            uVar9 = (uint)local_48;
            uVar2 = uVar9;
            if (uVar6 != uVar9) goto LAB_00104579;
            goto LAB_001045de;
          }
          local_5e = (x1->high_low_container).typecodes[uVar11 & 0xffff];
          pcVar3 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar11 & 0xffff],&local_5e,
                              (_Bool)((x1->high_low_container).flags & 1));
          ra = local_50;
          if (((x1->high_low_container).flags & 1) != 0) {
            (x1->high_low_container).containers[uVar11] = pcVar3;
            (x1->high_low_container).typecodes[uVar11] = local_5e;
          }
          ra_append(local_50,key_00,pcVar3,local_5e);
          if (uVar7 - 1 == iVar10) {
            uVar2 = (uint)local_48;
            prVar12 = local_58;
            uVar9 = local_5c;
            goto LAB_00104597;
          }
          uVar11 = uVar11 + 1;
          key_00 = (x1->high_low_container).keys[uVar11 & 0xffff];
        }
        local_5e = (x1->high_low_container).typecodes[uVar11 & 0xffff];
        local_5f = local_58->typecodes[local_5c & 0xffff];
        local_40 = container_lazy_xor((x1->high_low_container).containers[uVar11 & 0xffff],local_5e,
                                      local_58->containers[local_5c & 0xffff],local_5f,&local_5d);
        type = local_5d;
        _Var1 = container_nonzero_cardinality(local_40,local_5d);
        if (_Var1) {
          ra_append(local_50,key_00,local_40,type);
        }
        else {
          container_free(local_40,type);
        }
        uVar9 = uVar9 + 1;
        prVar12 = local_58;
        if ((uVar7 - 1 == iVar10) || (uVar9 == (uint)local_48)) break;
        uVar11 = uVar11 + 1;
        key_00 = (x1->high_low_container).keys[(uint)uVar11 & 0xffff];
        uVar6 = uVar9;
LAB_00104579:
        puVar4 = (ushort *)((ulong)((uVar6 & 0xffff) * 2) + (long)prVar12->keys);
        local_5c = uVar6;
      }
      uVar11 = (ulong)(iVar10 + 1);
      uVar2 = (uint)local_48;
LAB_001045de:
      uVar6 = (uint)uVar11;
      uVar7 = (uint)local_38;
      ra = local_50;
      if (uVar6 == uVar7) {
LAB_00104597:
        x1 = (roaring_bitmap_t *)prVar12;
        bVar8 = (x1->high_low_container).flags;
        uVar7 = uVar2;
        uVar6 = uVar9;
      }
      else {
        if (uVar9 != uVar2) {
          return (roaring_bitmap_t *)local_50;
        }
        bVar8 = (x1->high_low_container).flags;
      }
      ra_append_copy_range(ra,&x1->high_low_container,uVar6,uVar7,(_Bool)(bVar8 & 1));
      return (roaring_bitmap_t *)ra;
    }
  }
  prVar5 = roaring_bitmap_copy(prVar5);
  return prVar5;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_xor(const roaring_bitmap_t *x1,
                                          const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_lazy_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}